

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5RollbackToMethod(sqlite3_vtab *pVtab,int iSavepoint)

{
  int iVar1;
  Fts5FullTable *pTab;
  int iSavepoint_local;
  sqlite3_vtab *pVtab_local;
  
  fts5TripCursors((Fts5FullTable *)pVtab);
  iVar1 = sqlite3Fts5StorageRollback((Fts5Storage *)pVtab[1].zErrMsg);
  return iVar1;
}

Assistant:

static int fts5RollbackToMethod(sqlite3_vtab *pVtab, int iSavepoint){
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  UNUSED_PARAM(iSavepoint);  /* Call below is a no-op for NDEBUG builds */
  fts5CheckTransactionState(pTab, FTS5_ROLLBACKTO, iSavepoint);
  fts5TripCursors(pTab);
  return sqlite3Fts5StorageRollback(pTab->pStorage);
}